

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsObject.c
# Opt level: O0

void JsStandardGet(JsObject *self,char *prop,int *flag,JsValue *res)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  JsStandardSelfBlock *sb;
  JsProperty *p;
  int size;
  int i;
  JsValue *res_local;
  int *flag_local;
  char *prop_local;
  JsObject *self_local;
  
  puVar1 = (undefined8 *)*self->sb;
  JsLockup((JsLock)puVar1[2]);
  iVar3 = JsListSize((void *)*puVar1);
  p._4_4_ = 0;
  while( true ) {
    if (iVar3 <= p._4_4_) {
      JsUnlock((JsLock)puVar1[2]);
      if (self->Prototype == (JsObject *)0x0) {
        res->type = JS_UNDEFINED;
      }
      else {
        (*self->Prototype->Get)(self->Prototype,prop,flag,res);
      }
      return;
    }
    puVar5 = (undefined8 *)JsListGet((void *)*puVar1,p._4_4_);
    iVar4 = strcmp((char *)*puVar5,prop);
    if (iVar4 == 0) break;
    p._4_4_ = p._4_4_ + 1;
  }
  puVar2 = (undefined8 *)puVar5[1];
  *(undefined8 *)res = *puVar2;
  (res->u).number = (double)puVar2[1];
  (res->u).reference.name = (char *)puVar2[2];
  if (flag != (int *)0x0) {
    *flag = *(int *)(puVar5 + 2);
  }
  JsUnlock((JsLock)puVar1[2]);
  return;
}

Assistant:

void JsStandardGet(struct JsObject *self, char *prop,int* flag, struct JsValue *res){
	int i,size;
	struct JsProperty* p;
	struct JsStandardSelfBlock* sb;
	sb = (struct JsStandardSelfBlock*)self->sb[JS_STANDARD_OBJECT_FLOOR];
	//锁住
	JsLockup(sb->lock);
	size = JsListSize(sb->propertys);
	for(i=0;i<size;++i){
		p = (struct JsProperty*)JsListGet(sb->propertys,i);
		if(strcmp(p->name,prop) == 0){
			*res = *p->value;
			if(flag != NULL)
				*flag = p->attr;
			JsUnlock(sb->lock);
			return;
		}
	}
	//没有发现
	JsUnlock(sb->lock);

	if(!self->Prototype)
		res->type = JS_UNDEFINED;
	else
		(*self->Prototype->Get)(self->Prototype,prop,flag,res);

}